

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileFStream::Read(FileFStream *this,char *buffer,size_t size,size_t start)

{
  ulong uVar1;
  bool bVar2;
  anon_class_8_1_8991fb9c lf_Read;
  anon_class_8_1_8991fb9c local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_d0.this = this;
  WaitForOpen(this);
  if (start != 0xffffffffffffffff) {
    std::istream::seekg(&this->m_FileStream,start,0);
    std::__cxx11::to_string(&local_48,start);
    std::operator+(&local_c8,"couldn\'t move to start position ",&local_48);
    std::operator+(&local_a8,&local_c8," in file ");
    std::operator+(&local_88,&local_a8,&(this->super_Transport).m_Name);
    std::operator+(&local_68,&local_88,", in call to fstream seekg");
    CheckFile(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (0x7ffe7000 < size) {
    uVar1 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      Read::anon_class_8_1_8991fb9c::operator()(&local_d0,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
    }
  }
  Read::anon_class_8_1_8991fb9c::operator()(&local_d0,buffer,size);
  return;
}

Assistant:

void FileFStream::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        m_FileStream.read(buffer, static_cast<std::streamsize>(size));
        ProfilerStop("read");
        CheckFile("couldn't read from file " + m_Name + ", in call to fstream read");
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        m_FileStream.seekg(start);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to fstream seekg");
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}